

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O1

xmlParserInputPtr xmlCheckHTTPInput(xmlParserCtxtPtr ctxt,xmlParserInputPtr ret)

{
  xmlParserInputBufferPtr pxVar1;
  int iVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  xmlCharEncodingHandlerPtr handler;
  char *filename;
  char *msg;
  
  if (ret != (xmlParserInputPtr)0x0) {
    pxVar1 = ret->buf;
    if (pxVar1 == (xmlParserInputBufferPtr)0x0) {
      return ret;
    }
    if (pxVar1->readcallback != xmlIOHTTPRead) {
      return ret;
    }
    if (pxVar1->context == (void *)0x0) {
      return ret;
    }
    iVar2 = xmlNanoHTTPReturnCode(pxVar1->context);
    if (iVar2 < 400) {
      pxVar3 = (xmlChar *)xmlNanoHTTPMimeType(ret->buf->context);
      pxVar4 = xmlStrstr(pxVar3,"/xml");
      if (((pxVar4 != (xmlChar *)0x0) ||
          (pxVar3 = xmlStrstr(pxVar3,(xmlChar *)"+xml"), pxVar3 != (xmlChar *)0x0)) &&
         (pxVar3 = (xmlChar *)xmlNanoHTTPEncoding(ret->buf->context), pxVar3 != (xmlChar *)0x0)) {
        handler = xmlFindCharEncodingHandler((char *)pxVar3);
        if (handler == (xmlCharEncodingHandlerPtr)0x0) {
          __xmlErrEncoding(ctxt,XML_ERR_UNKNOWN_ENCODING,"Unknown encoding %s",pxVar3,(xmlChar *)0x0
                          );
        }
        else {
          xmlSwitchInputEncoding(ctxt,ret,handler);
        }
        if (ret->encoding == (xmlChar *)0x0) {
          pxVar3 = xmlStrdup(pxVar3);
          ret->encoding = pxVar3;
        }
      }
      pxVar3 = (xmlChar *)xmlNanoHTTPRedir(ret->buf->context);
      if (pxVar3 != (xmlChar *)0x0) {
        if (ret->filename != (char *)0x0) {
          (*xmlFree)(ret->filename);
        }
        if (ret->directory != (char *)0x0) {
          (*xmlFree)(ret->directory);
          ret->directory = (char *)0x0;
        }
        pxVar3 = xmlStrdup(pxVar3);
        ret->filename = (char *)pxVar3;
      }
      return ret;
    }
    filename = ret->filename;
    if (filename == (char *)0x0) {
      msg = "failed to load HTTP resource\n";
      filename = (char *)0x0;
    }
    else {
      msg = "failed to load HTTP resource \"%s\"\n";
    }
    __xmlLoaderErr(ctxt,msg,filename);
    xmlFreeInputStream(ret);
  }
  return (xmlParserInputPtr)0x0;
}

Assistant:

xmlParserInputPtr
xmlCheckHTTPInput(xmlParserCtxtPtr ctxt, xmlParserInputPtr ret) {
    /* Avoid unused variable warning if features are disabled. */
    (void) ctxt;

#ifdef LIBXML_HTTP_ENABLED
    if ((ret != NULL) && (ret->buf != NULL) &&
        (ret->buf->readcallback == xmlIOHTTPRead) &&
        (ret->buf->context != NULL)) {
        const char *encoding;
        const char *redir;
        const char *mime;
        int code;

        code = xmlNanoHTTPReturnCode(ret->buf->context);
        if (code >= 400) {
            /* fatal error */
	    if (ret->filename != NULL)
		__xmlLoaderErr(ctxt, "failed to load HTTP resource \"%s\"\n",
                         (const char *) ret->filename);
	    else
		__xmlLoaderErr(ctxt, "failed to load HTTP resource\n", NULL);
            xmlFreeInputStream(ret);
            ret = NULL;
        } else {

            mime = xmlNanoHTTPMimeType(ret->buf->context);
            if ((xmlStrstr(BAD_CAST mime, BAD_CAST "/xml")) ||
                (xmlStrstr(BAD_CAST mime, BAD_CAST "+xml"))) {
                encoding = xmlNanoHTTPEncoding(ret->buf->context);
                if (encoding != NULL) {
                    xmlCharEncodingHandlerPtr handler;

                    handler = xmlFindCharEncodingHandler(encoding);
                    if (handler != NULL) {
                        xmlSwitchInputEncoding(ctxt, ret, handler);
                    } else {
                        __xmlErrEncoding(ctxt, XML_ERR_UNKNOWN_ENCODING,
                                         "Unknown encoding %s",
                                         BAD_CAST encoding, NULL);
                    }
                    if (ret->encoding == NULL)
                        ret->encoding = xmlStrdup(BAD_CAST encoding);
                }
#if 0
            } else if (xmlStrstr(BAD_CAST mime, BAD_CAST "html")) {
#endif
            }
            redir = xmlNanoHTTPRedir(ret->buf->context);
            if (redir != NULL) {
                if (ret->filename != NULL)
                    xmlFree((xmlChar *) ret->filename);
                if (ret->directory != NULL) {
                    xmlFree((xmlChar *) ret->directory);
                    ret->directory = NULL;
                }
                ret->filename =
                    (char *) xmlStrdup((const xmlChar *) redir);
            }
        }
    }
#endif
    return(ret);
}